

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O0

void __thiscall
ImportSource_removeImportSourceByIndex_Test::TestBody
          (ImportSource_removeImportSourceByIndex_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_130 [2];
  AssertHelper local_110 [8];
  Message local_108 [15];
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  Message local_e0 [8];
  unsigned_long local_d8 [2];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_98 [8];
  Message local_90 [15];
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  Message local_68 [8];
  unsigned_long local_60 [2];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  ImportSourcePtr importSource;
  ImporterPtr importer;
  ImportSource_removeImportSourceByIndex_Test *this_local;
  
  this_00 = &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Importer::create(SUB81(this_00,0));
  libcellml::ImportSource::create();
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  libcellml::Importer::addImportSource((shared_ptr *)peVar3);
  local_60[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_60[0] = libcellml::Importer::importSourceCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_50,"size_t(1)","importer->importSourceCount()",local_60 + 1,
             local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x81,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar2 = libcellml::Importer::removeImportSource((ulong)peVar3);
  local_81 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_80,"importer->removeImportSource(0)",
               "false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d8[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_d8[0] = libcellml::Importer::importSourceCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_c8,"size_t(0)","importer->importSourceCount()",local_d8 + 1,
             local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar2 = libcellml::Importer::removeImportSource((ulong)peVar3);
  local_f9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_130,local_f8,"importer->removeImportSource(0)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    std::__cxx11::string::~string((string *)local_130);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_30);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ImportSource, removeImportSourceByIndex)
{
    auto importer = libcellml::Importer::create();

    auto importSource = libcellml::ImportSource::create();

    importer->addImportSource(importSource);

    EXPECT_EQ(size_t(1), importer->importSourceCount());

    EXPECT_TRUE(importer->removeImportSource(0));

    EXPECT_EQ(size_t(0), importer->importSourceCount());

    EXPECT_FALSE(importer->removeImportSource(0));
}